

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pystring.cpp
# Opt level: O1

string * pystring::mul(string *__return_storage_ptr__,string *str,int n)

{
  size_type sVar1;
  pointer pcVar2;
  ostringstream os;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  if (n < 1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = DAT_0012a3f0;
    pcVar2 = empty_string_abi_cxx11_;
  }
  else {
    if (n != 1) {
      std::__cxx11::ostringstream::ostringstream(aoStack_198);
      do {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)aoStack_198,(str->_M_dataplus)._M_p,str->_M_string_length);
        n = n + -1;
      } while (n != 0);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(aoStack_198);
      std::ios_base::~ios_base(local_128);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = str->_M_string_length;
    pcVar2 = (str->_M_dataplus)._M_p;
  }
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string mul( const std::string & str, int n )
    {
        // Early exits
        if (n <= 0) return empty_string;
        if (n == 1) return str;
        
        std::ostringstream os;
        for(int i=0; i<n; ++i)
        {
            os << str;
        }
        return os.str();
    }